

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

void deqp::gles3::Functional::DepthStencilCaseUtil::render
               (vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                *clears,int viewportX,int viewportY)

{
  pointer pCVar1;
  uint uVar2;
  int ndx;
  long lVar3;
  long lVar4;
  
  glwEnable(0xc11);
  lVar4 = 0x24;
  lVar3 = 0;
  while( true ) {
    pCVar1 = (clears->
             super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(clears->
                     super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x28) <= lVar3)
    break;
    uVar2 = *(uint *)((long)(pCVar1->color).m_data + lVar4 + -0x28);
    if ((uVar2 >> 0xe & 1) != 0) {
      glwClearColor(*(GLfloat *)((long)(pCVar1->color).m_data + lVar4 + -0x24),
                    *(GLfloat *)((long)(&pCVar1->color + -2) + lVar4),
                    *(GLfloat *)((long)(pCVar1->color).m_data + lVar4 + -0x1c),
                    *(GLfloat *)((long)(pCVar1->color).m_data + lVar4 + -0x18));
      uVar2 = *(uint *)((long)(pCVar1->color).m_data + lVar4 + -0x28);
    }
    if ((uVar2 >> 10 & 1) != 0) {
      glwClearStencil(*(GLint *)((long)(pCVar1->color).m_data + lVar4 + -0x14));
    }
    glwScissor(*(int *)((long)(pCVar1->color).m_data + lVar4 + -0x38) + viewportX,
               *(int *)((long)(pCVar1->color).m_data + lVar4 + -0x34) + viewportY,
               *(GLsizei *)((long)(&pCVar1->color + -3) + lVar4),
               *(GLsizei *)((long)(pCVar1->color).m_data + lVar4 + -0x2c));
    glwClear(*(GLbitfield *)((long)(pCVar1->color).m_data + lVar4 + -0x28));
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x28;
  }
  glwDisable(0xc11);
  return;
}

Assistant:

void render (const vector<ClearCommand>& clears, int viewportX, int viewportY)
{
	glEnable(GL_SCISSOR_TEST);

	for (int ndx = 0; ndx < (int)clears.size(); ndx++)
	{
		const ClearCommand& clear = clears[ndx];

		if (clear.buffers & GL_COLOR_BUFFER_BIT)	glClearColor(clear.color.x(), clear.color.y(), clear.color.z(), clear.color.w());
		if (clear.buffers & GL_STENCIL_BUFFER_BIT)	glClearStencil(clear.stencil);

		DE_ASSERT(clear.buffers == (clear.buffers & (GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))); // \note Don't use clear for depths.

		glScissor(clear.rect.left+viewportX, clear.rect.bottom+viewportY, clear.rect.width, clear.rect.height);
		glClear(clear.buffers);
	}

	glDisable(GL_SCISSOR_TEST);
}